

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O3

int map(thread_pool_t *pool,future_t *future,future_t *from,
       _func_void_ptr_void_ptr_size_t_size_t_ptr *function)

{
  runnable_t runnable;
  int iVar1;
  undefined8 *__ptr;
  
  iVar1 = -3;
  if ((function != (_func_void_ptr_void_ptr_size_t_size_t_ptr *)0x0 && from != (future_t *)0x0) &&
      (future != (future_t *)0x0 && pool != (thread_pool_t *)0x0)) {
    __ptr = (undefined8 *)malloc(0x18);
    *__ptr = future;
    __ptr[1] = from;
    __ptr[2] = function;
    iVar1 = sem_init((sem_t *)&future->mutex,0,0);
    if (iVar1 != 0) {
      free(__ptr);
    }
    runnable.arg = __ptr;
    runnable.function = map_fun;
    runnable.argsz = 0x18;
    iVar1 = defer(pool,runnable);
    if (iVar1 == 0) {
      future->status = true;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int map(thread_pool_t *pool, future_t *future, future_t *from,
        void *(*function)(void *, size_t, size_t *)) {

    if (!pool || !future || !from || !function) {
        return invalid_argument_error;
    }

    data_t *my_data = malloc(sizeof(data_t));
    my_data->to = future;
    my_data->from = from;
    my_data->function = function;

    if (sem_init(&(future->mutex), THREAD_SEMAPHORE, 0)) {
        free(my_data);
    }

    int err;

    if ((err = defer(pool, (runnable_t) {
            .function = map_fun,
            .arg = my_data,
            .argsz = sizeof(data_t)}))) {
        return err;
    }

    future->status = pending;

    return 0;
}